

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffh2st(fitsfile *fptr,char **header,int *status)

{
  int iVar1;
  void *pvVar2;
  LONGLONG local_40;
  LONGLONG headstart;
  long nrec;
  int *piStack_28;
  int nkeys;
  int *status_local;
  char **header_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    piStack_28 = status;
    status_local = (int *)header;
    header_local = (char **)fptr;
    iVar1 = ffghsp(fptr,(int *)((long)&nrec + 4),(int *)0x0,status);
    if (iVar1 < 1) {
      headstart = (LONGLONG)(nrec._4_4_ / 0x24 + 1);
      pvVar2 = calloc(headstart * 0xb40 + 1,1);
      *(void **)status_local = pvVar2;
      if (*(long *)status_local == 0) {
        *piStack_28 = 0x71;
        ffpmsg("failed to allocate memory to hold all the header keywords");
        fptr_local._4_4_ = *piStack_28;
      }
      else {
        ffghadll((fitsfile *)header_local,&local_40,(LONGLONG *)0x0,(LONGLONG *)0x0,piStack_28);
        ffmbyt((fitsfile *)header_local,local_40,0,piStack_28);
        ffgbyt((fitsfile *)header_local,headstart * 0xb40,*(void **)status_local,piStack_28);
        *(undefined1 *)(*(long *)status_local + headstart * 0xb40) = 0;
        fptr_local._4_4_ = *piStack_28;
      }
    }
    else {
      fptr_local._4_4_ = *piStack_28;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffh2st(fitsfile *fptr,   /* I - FITS file pointer           */
           char **header,    /* O - returned header string      */
           int  *status)     /* IO - error status               */

/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.
*/
{
    int nkeys;
    long nrec;
    LONGLONG headstart;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &nkeys, NULL, status) > 0)
        return(*status);

    nrec = (nkeys / 36 + 1);

    /* allocate memory for all the keywords (multiple of 2880 bytes) */
    *header = (char *) calloc ( nrec * 2880 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    ffghadll(fptr, &headstart, NULL, NULL, status); /* get header address */
    ffmbyt(fptr, headstart, REPORT_EOF, status);   /* move to header */
    ffgbyt(fptr, nrec * 2880, *header, status);     /* copy header */
    *(*header + (nrec * 2880)) = '\0';

    return(*status);
}